

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool bitset_container_equals(bitset_container_t *container1,bitset_container_t *container2)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  iVar3 = container1->cardinality;
  if ((iVar3 != -1) && (container2->cardinality != -1)) {
    if (iVar3 != container2->cardinality) {
      return false;
    }
    if (iVar3 == 0x10000) {
      return true;
    }
  }
  lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar5 + 4) & 0x20) == 0) {
    return true;
  }
  if (*(undefined1 (*) [32])container1->words != *(undefined1 (*) [32])container2->words) {
    return false;
  }
  lVar5 = 0x20;
  uVar4 = 0;
  do {
    uVar6 = uVar4;
    if (uVar6 == 0xff) break;
    pauVar1 = (undefined1 (*) [32])(*(undefined1 (*) [32])container1->words + lVar5);
    pauVar2 = (undefined1 (*) [32])(*(undefined1 (*) [32])container2->words + lVar5);
    lVar5 = lVar5 + 0x20;
    uVar4 = uVar6 + 1;
  } while (*pauVar1 == *pauVar2);
  return 0xfe < uVar6;
}

Assistant:

bool bitset_container_equals(const bitset_container_t *container1, const bitset_container_t *container2) {
	if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
		if(container1->cardinality != container2->cardinality) {
			return false;
		}
    if (container1->cardinality == INT32_C(0x10000)) {
        return true;
    }
	}
#ifdef CROARING_IS_X64
  if( croaring_avx2() ) {
    return _avx2_bitset_container_equals(container1, container2);
  }
#else
  return memcmp(container1->words,
                container2->words,
                BITSET_CONTAINER_SIZE_IN_WORDS*sizeof(uint64_t)) == 0;
#endif
	return true;
}